

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall duckdb_parquet::BloomFilterHash::printTo(BloomFilterHash *this,ostream *out)

{
  _BloomFilterHash__isset _Var1;
  string local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"BloomFilterHash(",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"XXHASH=",7);
  _Var1 = this->__isset;
  if (((byte)_Var1 & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::XxHash>(&local_40,&this->XXHASH);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)out,local_40._M_dataplus._M_p,local_40._M_string_length);
  }
  if ((((byte)_Var1 & 1) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2)) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,")",1);
  return;
}

Assistant:

void BloomFilterHash::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "BloomFilterHash(";
  out << "XXHASH="; (__isset.XXHASH ? (out << to_string(XXHASH)) : (out << "<null>"));
  out << ")";
}